

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O0

TimerId __thiscall
QAbstractEventDispatcher::registerTimer
          (QAbstractEventDispatcher *this,Duration interval,TimerType timerType,QObject *object)

{
  long lVar1;
  TimerId e;
  underlying_type_t<Qt::TimerId> uVar2;
  nanoseconds interval_00;
  longlong lVar3;
  undefined8 in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractEventDispatcherV2 *self;
  TimerId id;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  e = QAbstractEventDispatcherPrivate::allocateTimerId();
  interval_00.__r =
       (rep)::v2((QAbstractEventDispatcher *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((QAbstractEventDispatcherV2 *)interval_00.__r == (QAbstractEventDispatcherV2 *)0x0) {
    uVar2 = qToUnderlying<Qt::TimerId>(e);
    lVar3 = fromDuration<long_long>(interval_00);
    (**(code **)(*in_RDI + 0x78))(in_RDI,uVar2,lVar3,in_EDX,in_RCX);
  }
  else {
    (*(((QAbstractEventDispatcherV2 *)interval_00.__r)->super_QAbstractEventDispatcher).
      super_QObject._vptr_QObject[0x18])(interval_00.__r,(ulong)e,in_RSI,(ulong)in_EDX,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return e;
  }
  __stack_chk_fail();
}

Assistant:

Qt::TimerId QAbstractEventDispatcher::registerTimer(Duration interval, Qt::TimerType timerType,
                                                    QObject *object)
{
    auto id = Qt::TimerId(QAbstractEventDispatcherPrivate::allocateTimerId());
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    if (QAbstractEventDispatcherV2 *self = v2(this))
        self->registerTimer(id, interval, timerType, object);
    else
        registerTimer(qToUnderlying(id), fromDuration<qint64>(interval), timerType, object);
#else
    registerTimer(id, interval, timerType, object);
#endif
    return id;
}